

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  uint uVar1;
  ZSTD_matchState_t *pZVar2;
  int iVar3;
  U32 UVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  ulong uVar18;
  size_t sVar19;
  size_t offsetFound;
  U32 local_a8;
  U32 local_a4;
  size_t local_90;
  BYTE *local_88;
  BYTE *local_80;
  int *local_78;
  BYTE *local_70;
  ulong local_68;
  BYTE *local_60;
  ZSTD_matchState_t *local_58;
  seqStore_t *local_50;
  BYTE *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  pBVar11 = (ms->window).base;
  uVar1 = (ms->window).dictLimit;
  local_88 = pBVar11 + uVar1;
  local_a4 = *rep;
  pZVar2 = ms->dictMatchState;
  local_80 = (pZVar2->window).nextSrc;
  local_60 = (pZVar2->window).base;
  local_40 = local_60 + (pZVar2->window).dictLimit;
  local_68 = (ulong)(((int)local_60 - (int)local_80) + uVar1);
  local_a8 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  iEnd = (BYTE *)((long)src + srcSize);
  local_78 = (int *)((long)src + (srcSize - 8));
  local_48 = local_60 + -local_68;
  piVar16 = (int *)((ulong)(((int)src - (int)local_88) + (int)local_80 == (int)local_40) + (long)src
                   );
  local_58 = ms;
  local_50 = seqStore;
  local_38 = rep;
  do {
    while( true ) {
      if (local_78 <= piVar16) {
        *local_38 = local_a4;
        local_38[1] = local_a8;
        return (long)iEnd - (long)src;
      }
      uVar5 = (((int)piVar16 - (int)pBVar11) - local_a4) + 1;
      piVar15 = (int *)(pBVar11 + uVar5);
      if (uVar5 < uVar1) {
        piVar15 = (int *)(local_60 + (uVar5 - (int)local_68));
      }
      if ((uVar5 - uVar1 < 0xfffffffd) && (*piVar15 == *(int *)((long)piVar16 + 1))) {
        pBVar10 = iEnd;
        if (uVar5 < uVar1) {
          pBVar10 = local_80;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar16 + 5),(BYTE *)(piVar15 + 1),iEnd,pBVar10,local_88);
        uVar18 = sVar6 + 4;
      }
      else {
        uVar18 = 0;
      }
      local_90 = 999999999;
      sVar6 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS(local_58,(BYTE *)piVar16,iEnd,&local_90)
      ;
      uVar8 = uVar18;
      if (uVar18 < sVar6) {
        uVar8 = sVar6;
      }
      if (3 < uVar8) break;
      piVar16 = (int *)((long)piVar16 + ((long)piVar16 - (long)src >> 8) + 1);
    }
    piVar15 = piVar16;
    sVar7 = local_90;
    local_70 = pBVar11;
    if (sVar6 <= uVar18) {
      piVar15 = (int *)((long)piVar16 + 1);
      sVar7 = 0;
    }
LAB_001311e1:
    do {
      sVar6 = uVar8;
      sVar19 = sVar7;
      piVar17 = piVar16;
      piVar14 = piVar15;
      if (local_78 <= piVar17) break;
      piVar15 = (int *)((long)piVar17 + 1);
      uVar5 = ((int)piVar15 - (int)local_70) - local_a4;
      piVar16 = (int *)(local_70 + uVar5);
      if (uVar5 < uVar1) {
        piVar16 = (int *)(local_60 + (uVar5 - (int)local_68));
      }
      if ((uVar5 - uVar1 < 0xfffffffd) && (*piVar16 == *piVar15)) {
        pBVar11 = iEnd;
        if (uVar5 < uVar1) {
          pBVar11 = local_80;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar17 + 5),(BYTE *)(piVar16 + 1),iEnd,pBVar11,local_88);
        if (sVar7 < 0xfffffffffffffffc) {
          uVar9 = (int)sVar19 + 1;
          uVar5 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 3 + -0x1e) < (int)(sVar7 + 4) * 3) {
            sVar19 = 0;
            piVar14 = piVar15;
            sVar6 = sVar7 + 4;
          }
        }
      }
      local_90 = 999999999;
      uVar8 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS(local_58,(BYTE *)piVar15,iEnd,&local_90)
      ;
      if (3 < uVar8) {
        uVar9 = (int)sVar19 + 1;
        uVar5 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar9 = (int)local_90 + 1;
        iVar3 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        piVar16 = piVar15;
        sVar7 = local_90;
        if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 4 + -0x1b) < (int)uVar8 * 4 - iVar3)
        goto LAB_001311e1;
      }
      if (local_78 <= piVar15) break;
      piVar15 = (int *)((long)piVar17 + 2);
      uVar5 = ((int)piVar15 - (int)local_70) - local_a4;
      piVar16 = (int *)(local_70 + uVar5);
      if (uVar5 < uVar1) {
        piVar16 = (int *)(local_60 + (uVar5 - (int)local_68));
      }
      if ((uVar5 - uVar1 < 0xfffffffd) && (*piVar16 == *piVar15)) {
        pBVar11 = iEnd;
        if (uVar5 < uVar1) {
          pBVar11 = local_80;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar17 + 6),(BYTE *)(piVar16 + 1),iEnd,pBVar11,local_88);
        if (sVar7 < 0xfffffffffffffffc) {
          uVar9 = (int)sVar19 + 1;
          uVar5 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          if ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 4 + -0x1e) < (int)(sVar7 + 4) * 4) {
            sVar19 = 0;
            piVar14 = piVar15;
            sVar6 = sVar7 + 4;
          }
        }
      }
      local_90 = 999999999;
      uVar8 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS(local_58,(BYTE *)piVar15,iEnd,&local_90)
      ;
      if (uVar8 < 4) break;
      uVar9 = (int)sVar19 + 1;
      uVar5 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar9 = (int)local_90 + 1;
      iVar3 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      piVar16 = piVar15;
      sVar7 = local_90;
    } while ((int)((uVar5 ^ 0x1f) + (int)sVar6 * 4 + -0x18) < (int)uVar8 * 4 - iVar3);
    pBVar11 = local_70;
    if (sVar19 == 0) {
      sVar19 = 0;
    }
    else {
      pBVar12 = (BYTE *)((long)piVar14 + (-(long)local_70 - sVar19) + -0xfffffffe);
      pBVar13 = local_70;
      pBVar10 = local_88;
      if ((uint)pBVar12 < uVar1) {
        pBVar13 = local_48;
        pBVar10 = local_40;
      }
      pBVar13 = pBVar13 + ((ulong)pBVar12 & 0xffffffff);
      for (; ((src < piVar14 && (pBVar10 < pBVar13)) &&
             (*(BYTE *)((long)piVar14 + -1) == pBVar13[-1])); piVar14 = (int *)((long)piVar14 + -1))
      {
        pBVar13 = pBVar13 + -1;
        sVar6 = sVar6 + 1;
      }
      local_a8 = local_a4;
      local_a4 = (int)sVar19 - 2;
    }
    ZSTD_storeSeq(local_50,(long)piVar14 - (long)src,src,(U32)sVar19,sVar6 - 3);
    UVar4 = local_a8;
    for (src = (void *)((long)piVar14 + sVar6); local_a8 = UVar4, piVar16 = (int *)src,
        src <= local_78; src = (void *)((long)src + sVar6 + 4)) {
      uVar5 = ((int)src - (int)pBVar11) - local_a8;
      pBVar10 = pBVar11;
      if (uVar5 < uVar1) {
        pBVar10 = local_48;
      }
      if ((0xfffffffc < uVar5 - uVar1) || (*(int *)(pBVar10 + uVar5) != *src)) break;
      pBVar13 = iEnd;
      if (uVar5 < uVar1) {
        pBVar13 = local_80;
      }
      sVar6 = ZSTD_count_2segments
                        ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar10 + uVar5) + 4),iEnd,pBVar13,
                         local_88);
      ZSTD_storeSeq(local_50,0,src,0,sVar6 + 1);
      UVar4 = local_a4;
      local_a4 = local_a8;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 1, 2, ZSTD_dictMatchState);
}